

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor.cpp
# Opt level: O2

Tenor * bidfx_public_api::Tenor::GetTenorFromString(string *tenor)

{
  size_type sVar1;
  mapped_type *ppTVar2;
  ostream *poVar3;
  invalid_argument *this;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  if (tenor_list__abi_cxx11_._40_8_ == 0) {
    CreateTenorList();
  }
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                   *)tenor_list__abi_cxx11_,tenor);
  if (sVar1 != 0) {
    ppTVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                            *)tenor_list__abi_cxx11_,tenor);
    return *ppTVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_190,"Tenor ");
  poVar3 = std::operator<<(poVar3,(string *)tenor);
  poVar3 = std::operator<<(poVar3," does not exist");
  std::endl<char,std::char_traits<char>>(poVar3);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

const Tenor& Tenor::GetTenorFromString(const std::string &tenor)
{
    if (tenor_list_.empty())
    {
        CreateTenorList();
    }

    if (tenor_list_.count(tenor))
    {
        return *tenor_list_[tenor];
    }

    std::stringstream ss;
    ss << "Tenor " << tenor << " does not exist" << std::endl;
    throw std::invalid_argument(ss.str());
}